

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O0

Vec_Int_t * Wlc_NtkGetBlacks(Wlc_Ntk_t *p,Wlc_Par_t *pPars)

{
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Bit_t *p_01;
  Wlc_Obj_t *pWVar2;
  uint local_54;
  int nTotal;
  Vec_Bit_t *vMarks;
  int Count [4];
  int local_2c;
  int i;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vBlacks;
  Wlc_Par_t *pPars_local;
  Wlc_Ntk_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  memset(&vMarks,0,0x10);
  local_54 = 0;
  p_01 = Wlc_NtkMarkLimit(p,pPars);
  for (local_2c = 1; iVar1 = Wlc_NtkObjNumMax(p), local_2c < iVar1; local_2c = local_2c + 1) {
    pWVar2 = Wlc_NtkObj(p,local_2c);
    if ((((undefined1  [24])((undefined1  [24])*pWVar2 & (undefined1  [24])0x3f) ==
          (undefined1  [24])0x2b) ||
        ((undefined1  [24])((undefined1  [24])*pWVar2 & (undefined1  [24])0x3f) ==
         (undefined1  [24])0x2c)) ||
       ((undefined1  [24])((undefined1  [24])*pWVar2 & (undefined1  [24])0x3f) ==
        (undefined1  [24])0x32)) {
      iVar1 = Wlc_ObjRange(pWVar2);
      if (pPars->nBitsAdd <= iVar1) {
        local_54 = local_54 + 1;
        if (p_01 == (Vec_Bit_t *)0x0) {
          iVar1 = Wlc_ObjId(p,pWVar2);
          Vec_IntPushUniqueOrder(p_00,iVar1);
          vMarks._0_4_ = (uint)vMarks + 1;
        }
        else {
          iVar1 = Vec_BitEntry(p_01,local_2c);
          if (iVar1 != 0) {
            iVar1 = Wlc_ObjId(p,pWVar2);
            Vec_IntPushUniqueOrder(p_00,iVar1);
            vMarks._0_4_ = (uint)vMarks + 1;
          }
        }
      }
    }
    else if ((((undefined1  [24])((undefined1  [24])*pWVar2 & (undefined1  [24])0x3f) ==
               (undefined1  [24])0x2d) ||
             ((undefined1  [24])((undefined1  [24])*pWVar2 & (undefined1  [24])0x3f) ==
              (undefined1  [24])0x2e)) ||
            (((undefined1  [24])((undefined1  [24])*pWVar2 & (undefined1  [24])0x3f) ==
              (undefined1  [24])0x2f ||
             ((undefined1  [24])((undefined1  [24])*pWVar2 & (undefined1  [24])0x3f) ==
              (undefined1  [24])0x30)))) {
      iVar1 = Wlc_ObjRange(pWVar2);
      if (pPars->nBitsMul <= iVar1) {
        local_54 = local_54 + 1;
        if (p_01 == (Vec_Bit_t *)0x0) {
          iVar1 = Wlc_ObjId(p,pWVar2);
          Vec_IntPushUniqueOrder(p_00,iVar1);
          vMarks._4_4_ = vMarks._4_4_ + 1;
        }
        else {
          iVar1 = Vec_BitEntry(p_01,local_2c);
          if (iVar1 != 0) {
            iVar1 = Wlc_ObjId(p,pWVar2);
            Vec_IntPushUniqueOrder(p_00,iVar1);
            vMarks._4_4_ = vMarks._4_4_ + 1;
          }
        }
      }
    }
    else if ((undefined1  [24])((undefined1  [24])*pWVar2 & (undefined1  [24])0x3f) ==
             (undefined1  [24])0x8) {
      iVar1 = Wlc_ObjRange(pWVar2);
      if (pPars->nBitsMux <= iVar1) {
        local_54 = local_54 + 1;
        if (p_01 == (Vec_Bit_t *)0x0) {
          iVar1 = Wlc_ObjId(p,pWVar2);
          Vec_IntPushUniqueOrder(p_00,iVar1);
          Count[0] = Count[0] + 1;
        }
        else {
          iVar1 = Vec_BitEntry(p_01,local_2c);
          if (iVar1 != 0) {
            iVar1 = Wlc_ObjId(p,pWVar2);
            Vec_IntPushUniqueOrder(p_00,iVar1);
            Count[0] = Count[0] + 1;
          }
        }
      }
    }
    else {
      iVar1 = Wlc_ObjIsCi(pWVar2);
      if (((iVar1 != 0) && (iVar1 = Wlc_ObjIsPi(pWVar2), iVar1 == 0)) &&
         (iVar1 = Wlc_ObjRange(pWVar2), pPars->nBitsFlop <= iVar1)) {
        local_54 = local_54 + 1;
        if (p_01 == (Vec_Bit_t *)0x0) {
          pWVar2 = Wlc_ObjFo2Fi(p,pWVar2);
          iVar1 = Wlc_ObjId(p,pWVar2);
          Vec_IntPushUniqueOrder(p_00,iVar1);
          Count[1] = Count[1] + 1;
        }
        else {
          iVar1 = Vec_BitEntry(p_01,local_2c);
          if (iVar1 != 0) {
            pWVar2 = Wlc_ObjFo2Fi(p,pWVar2);
            iVar1 = Wlc_ObjId(p,pWVar2);
            Vec_IntPushUniqueOrder(p_00,iVar1);
            Count[1] = Count[1] + 1;
          }
        }
      }
    }
  }
  if (p_01 != (Vec_Bit_t *)0x0) {
    Vec_BitFree(p_01);
  }
  if (pPars->fVerbose != 0) {
    printf("Abstraction engine marked %d adds/subs, %d muls/divs, %d muxes, and %d flops to be abstracted away (out of %d signals).\n"
           ,(ulong)(uint)vMarks,(ulong)vMarks._4_4_,(ulong)(uint)Count[0],(ulong)(uint)Count[1],
           (ulong)local_54);
  }
  return p_00;
}

Assistant:

static Vec_Int_t * Wlc_NtkGetBlacks( Wlc_Ntk_t * p, Wlc_Par_t * pPars )
{
    Vec_Int_t * vBlacks = Vec_IntAlloc( 100 ) ;
    Wlc_Obj_t * pObj; int i, Count[4] = {0};
    Vec_Bit_t * vMarks = NULL;
    int nTotal = 0;

    vMarks = Wlc_NtkMarkLimit( p, pPars ) ; 

    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( pObj->Type == WLC_OBJ_ARI_ADD || pObj->Type == WLC_OBJ_ARI_SUB || pObj->Type == WLC_OBJ_ARI_MINUS )
        {
            if ( Wlc_ObjRange(pObj) >= pPars->nBitsAdd )
            {
                ++nTotal;
                if ( vMarks == NULL )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId(p, pObj) ), Count[0]++;
                else if ( Vec_BitEntry( vMarks, i ) )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId(p, pObj) ), Count[0]++;
            }
            continue;
        }
        if ( pObj->Type == WLC_OBJ_ARI_MULTI || pObj->Type == WLC_OBJ_ARI_DIVIDE || pObj->Type == WLC_OBJ_ARI_REM || pObj->Type == WLC_OBJ_ARI_MODULUS )
        {
            if ( Wlc_ObjRange(pObj) >= pPars->nBitsMul )
            {
                ++nTotal;
                if ( vMarks == NULL )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId(p, pObj) ), Count[1]++;
                else if ( Vec_BitEntry( vMarks, i ) )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId(p, pObj) ), Count[1]++;
            }
            continue;
        }
        if ( pObj->Type == WLC_OBJ_MUX )
        {
            if ( Wlc_ObjRange(pObj) >= pPars->nBitsMux )
            {
                ++nTotal;
                if ( vMarks == NULL )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId(p, pObj) ), Count[2]++;
                else if ( Vec_BitEntry( vMarks, i ) )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId(p, pObj) ), Count[2]++;
            }
            continue;
        }
        if ( Wlc_ObjIsCi(pObj) && !Wlc_ObjIsPi(pObj) )
        {
            if ( Wlc_ObjRange(pObj) >= pPars->nBitsFlop )
            {
                ++nTotal;
                if ( vMarks == NULL )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId( p, Wlc_ObjFo2Fi( p, pObj ) ) ), Count[3]++;
                else if ( Vec_BitEntry( vMarks, i ) )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId( p, Wlc_ObjFo2Fi( p, pObj ) ) ), Count[3]++;
            }
            continue;
        }
    }
    if ( vMarks )
        Vec_BitFree( vMarks );
    if ( pPars->fVerbose )
        printf( "Abstraction engine marked %d adds/subs, %d muls/divs, %d muxes, and %d flops to be abstracted away (out of %d signals).\n", Count[0], Count[1], Count[2], Count[3], nTotal );
    return vBlacks;
}